

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O1

Future<double> * __thiscall
Omega_h::Dist::iexch<double>
          (Future<double> *__return_storage_ptr__,Dist *this,Read<double> *data,Int width)

{
  int *piVar1;
  void *pvVar2;
  Alloc *pAVar3;
  Comm *this_00;
  ScopedTimer exch_timer;
  ScopedTimer local_b9;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  Read<int> local_98;
  Read<double> local_88;
  Read<signed_char> local_78;
  Read<signed_char> local_68;
  Read<int> local_58;
  LOs local_48;
  LOs local_38;
  
  begin_code("Dist::iexch",(char *)0x0);
  pvVar2 = this->roots2items_[0].write_.shared_alloc_.direct_ptr;
  if (pvVar2 != (void *)0x0) {
    local_68.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_68.write_.shared_alloc_.alloc =
             (Alloc *)((local_68.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_68.write_.shared_alloc_.alloc)->use_count =
             (local_68.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_68.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
    local_38.write_.shared_alloc_.alloc = this->roots2items_[0].write_.shared_alloc_.alloc;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_38.write_.shared_alloc_.alloc =
             (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_38.write_.shared_alloc_.alloc)->use_count =
             (local_38.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_38.write_.shared_alloc_.direct_ptr = pvVar2;
    expand<double>((Omega_h *)local_b8._M_pod_data,&local_68,&local_38,width);
    pAVar3 = (data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_38.write_.shared_alloc_.alloc;
    (data->write_).shared_alloc_.alloc = (Alloc *)local_b8._M_unused._0_8_;
    (data->write_).shared_alloc_.direct_ptr = (void *)local_b8._8_8_;
    if (((local_b8._M_unused._M_member_pointer & 7) == 0 &&
         (Alloc *)local_b8._M_unused._0_8_ != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(local_b8._M_unused._M_function_pointer + 0x30) =
           *(int *)(local_b8._M_unused._M_function_pointer + 0x30) + -1;
      (data->write_).shared_alloc_.alloc = (Alloc *)(*local_b8._M_unused._M_object * 8 + 1);
    }
    local_b8._M_unused._M_object = (Alloc *)0x0;
    local_b8._8_8_ = (void *)0x0;
    if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
        local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_38.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_38.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_68.write_.shared_alloc_.alloc;
    if (((ulong)local_68.write_.shared_alloc_.alloc & 7) == 0 &&
        local_68.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  pvVar2 = this->items2content_[0].write_.shared_alloc_.direct_ptr;
  if (pvVar2 != (void *)0x0) {
    local_78.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_78.write_.shared_alloc_.alloc =
             (Alloc *)((local_78.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_78.write_.shared_alloc_.alloc)->use_count =
             (local_78.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_78.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
    local_48.write_.shared_alloc_.alloc = this->items2content_[0].write_.shared_alloc_.alloc;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_48.write_.shared_alloc_.alloc =
             (Alloc *)((local_48.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_48.write_.shared_alloc_.alloc)->use_count =
             (local_48.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_48.write_.shared_alloc_.direct_ptr = pvVar2;
    permute<double>((Omega_h *)local_b8._M_pod_data,&local_78,&local_48,width);
    pAVar3 = (data->write_).shared_alloc_.alloc;
    if (((ulong)pAVar3 & 7) == 0 && pAVar3 != (Alloc *)0x0) {
      piVar1 = &pAVar3->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(pAVar3);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_48.write_.shared_alloc_.alloc;
    (data->write_).shared_alloc_.alloc = (Alloc *)local_b8._M_unused._0_8_;
    (data->write_).shared_alloc_.direct_ptr = (void *)local_b8._8_8_;
    if (((local_b8._M_unused._M_member_pointer & 7) == 0 &&
         (Alloc *)local_b8._M_unused._0_8_ != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      *(int *)(local_b8._M_unused._M_function_pointer + 0x30) =
           *(int *)(local_b8._M_unused._M_function_pointer + 0x30) + -1;
      (data->write_).shared_alloc_.alloc = (Alloc *)(*local_b8._M_unused._M_object * 8 + 1);
    }
    local_b8._M_unused._M_object = (Alloc *)0x0;
    local_b8._8_8_ = (void *)0x0;
    if (((ulong)local_48.write_.shared_alloc_.alloc & 7) == 0 &&
        local_48.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_48.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_48.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    pAVar3 = local_78.write_.shared_alloc_.alloc;
    if (((ulong)local_78.write_.shared_alloc_.alloc & 7) == 0 &&
        local_78.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_78.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_78.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
  }
  this_00 = this->comm_[0].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.write_.shared_alloc_.alloc = (data->write_).shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_88.write_.shared_alloc_.alloc =
           (Alloc *)((local_88.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_88.write_.shared_alloc_.alloc)->use_count =
           (local_88.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_88.write_.shared_alloc_.direct_ptr = (data->write_).shared_alloc_.direct_ptr;
  local_98.write_.shared_alloc_.alloc = this->msgs2content_[0].write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = this->msgs2content_[0].write_.shared_alloc_.direct_ptr;
  local_58.write_.shared_alloc_.alloc = this->msgs2content_[1].write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_58.write_.shared_alloc_.alloc =
           (Alloc *)((local_58.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_58.write_.shared_alloc_.alloc)->use_count =
           (local_58.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_58.write_.shared_alloc_.direct_ptr = this->msgs2content_[1].write_.shared_alloc_.direct_ptr;
  Comm::ialltoallv<double>(__return_storage_ptr__,this_00,&local_88,&local_98,&local_58,width);
  pAVar3 = local_58.write_.shared_alloc_.alloc;
  if (((ulong)local_58.write_.shared_alloc_.alloc & 7) == 0 &&
      local_58.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_58.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_58.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_88.write_.shared_alloc_.alloc;
  if (((ulong)local_88.write_.shared_alloc_.alloc & 7) == 0 &&
      local_88.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_88.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_88.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  local_b8._12_4_ = 0;
  local_b8._8_4_ = width;
  pcStack_a0 = std::
               _Function_handler<Omega_h::Read<double>_(Omega_h::Read<double>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp:135:19)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<Omega_h::Read<double>_(Omega_h::Read<double>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_dist.cpp:135:19)>
             ::_M_manager;
  local_b8._M_unused._M_object = this;
  Future<double>::add_callback(__return_storage_ptr__,(additional_callback_type *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  ScopedTimer::~ScopedTimer(&local_b9);
  return __return_storage_ptr__;
}

Assistant:

Future<T> Dist::iexch(Read<T> data, Int width) const {
  ScopedTimer exch_timer("Dist::iexch");
  if (roots2items_[F].exists()) {
    data = expand(data, roots2items_[F], width);
  }
  if (items2content_[F].exists()) {
    data = permute(data, items2content_[F], width);
  }
  auto future = comm_[F]->ialltoallv(data, msgs2content_[F], msgs2content_[R], width);
  auto callback = [this,width](Read<T> buf) {
    if (this->items2content_[R].exists()) {
      buf = unmap(this->items2content_[R], buf, width);
    }
    return buf;
  };
  future.add_callback(callback);
  return future;
}